

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CheckboxUI.cpp
# Opt level: O2

void __thiscall nite::CheckboxUI::setFontSize(CheckboxUI *this,int size)

{
  undefined1 local_48 [8];
  string fn;
  
  if (0 < size) {
    this->fontSize = size;
    Font::getFilename_abi_cxx11_((string *)local_48,&this->font);
    if (fn._M_dataplus._M_p != (pointer)0x0) {
      Font::load(&this->font,(string *)local_48,size,1.0);
    }
    (*(this->super_BaseUIComponent)._vptr_BaseUIComponent[6])(this);
    (*(this->super_BaseUIComponent)._vptr_BaseUIComponent[7])(this);
    std::__cxx11::string::~string((string *)local_48);
  }
  return;
}

Assistant:

void nite::CheckboxUI::setFontSize(int size){
    if(size <= 0) return;
    this->fontSize = size;
    auto fn = font.getFilename();
    if(fn.length() > 0){
        font.load(fn, size, 1.0f);
    }
    calculateSize();  
    recalculate(); 
}